

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O1

void proxy_telnet_process_queue(ProxyNegotiator *pn)

{
  BinarySink **ctx;
  int iVar1;
  Plug *pPVar2;
  SeatPromptResult spr_00;
  Interactor *pIVar3;
  char *pcVar4;
  prompts_t *ppVar5;
  InteractionReadySeat IVar6;
  strbuf *buf_o;
  size_t sVar7;
  int *crLine;
  undefined4 uVar8;
  ptrlen pl;
  ptrlen str;
  ptrlen pl_00;
  uint flags;
  SeatPromptResult spr;
  byte local_54 [4];
  SeatPromptResult local_50;
  
  ctx = &pn[-1].output[0].binarysink_[0].binarysink_;
  iVar1 = *(int *)&pn[-1].output[0].binarysink_[0].binarysink_;
  if ((iVar1 == 299) || (iVar1 == 0x120)) {
    IVar6 = interactor_announce(pn->itr);
    (*(IVar6.seat)->vt->get_userpass_input)(&local_50,IVar6.seat,(prompts_t *)pn[-1].error);
    if (local_50.kind != SPRK_OK) {
      uVar8 = 299;
      if (local_50.kind - SPRK_USER_ABORT < 2) {
        spr_00._4_4_ = local_50._4_4_;
        spr_00.kind = local_50.kind;
        spr_00.errfn = local_50.errfn;
        spr_00.errdata_lit = local_50.errdata_lit;
        spr_00.errdata_u = local_50.errdata_u;
        spr_00._28_4_ = local_50._28_4_;
        proxy_spr_abort(pn,spr_00);
        uVar8 = 0;
      }
      goto LAB_001469eb;
    }
    iVar1._0_1_ = pn[-1].aborted;
    iVar1._1_1_ = pn[-1].reconnect;
    iVar1._2_2_ = *(undefined2 *)&pn[-1].field_0x52;
    if ((long)iVar1 != -1) {
      pIVar3 = pn[-1].itr;
      pcVar4 = prompt_get_result_ref
                         (*(prompt_t **)(*(long *)(pn[-1].error + 0x38) + (long)iVar1 * 8));
      conf_set_str((Conf *)pIVar3,0x10,pcVar4);
    }
    if ((long)*(int *)&pn[-1].field_0x54 != -1) {
      pIVar3 = pn[-1].itr;
      pcVar4 = prompt_get_result_ref
                         (*(prompt_t **)
                           (*(long *)(pn[-1].error + 0x38) + (long)*(int *)&pn[-1].field_0x54 * 8));
      conf_set_str((Conf *)pIVar3,0x11,pcVar4);
    }
    free_prompts((prompts_t *)pn[-1].error);
    pn[-1].error = (char *)0x0;
  }
  else {
    uVar8 = 0;
    if (iVar1 != 0) goto LAB_001469eb;
    pIVar3 = (Interactor *)conf_copy(pn->ps->conf);
    pn[-1].itr = pIVar3;
    pcVar4 = format_telnet_command
                       (pn->ps->remote_addr,pn->ps->remote_port,(Conf *)pIVar3,(uint *)local_54);
    *(char **)&pn[-1].done = pcVar4;
    if ((pn->itr != (Interactor *)0x0) && ((local_54[0] & 3) != 0)) {
      burnstr(pcVar4);
      *(undefined8 *)&pn[-1].done = 0;
      ppVar5 = proxy_new_prompts(pn->ps);
      pn[-1].error = &ppVar5->to_server;
      ppVar5->to_server = true;
      ppVar5->from_server = false;
      pcVar4 = dupstr("Telnet proxy authentication");
      ppVar5 = (prompts_t *)pn[-1].error;
      ppVar5->name = pcVar4;
      if ((local_54[0] & 1) == 0) {
        pn[-1].aborted = true;
        pn[-1].reconnect = true;
        *(undefined2 *)&pn[-1].field_0x52 = 0xffff;
      }
      else {
        uVar8 = (undefined4)ppVar5->n_prompts;
        pn[-1].aborted = (_Bool)(char)uVar8;
        pn[-1].reconnect = (_Bool)(char)((uint)uVar8 >> 8);
        *(short *)&pn[-1].field_0x52 = (short)((uint)uVar8 >> 0x10);
        pcVar4 = dupstr("Proxy username: ");
        add_prompt(ppVar5,pcVar4,true);
      }
      if ((local_54[0] & 2) == 0) {
        *(undefined4 *)&pn[-1].field_0x54 = 0xffffffff;
      }
      else {
        ppVar5 = (prompts_t *)pn[-1].error;
        *(int *)&pn[-1].field_0x54 = (int)ppVar5->n_prompts;
        pcVar4 = dupstr("Proxy password: ");
        add_prompt(ppVar5,pcVar4,false);
      }
      queue_toplevel_callback(proxy_telnet_process_queue_callback,ctx);
      uVar8 = 0x120;
      goto LAB_001469eb;
    }
  }
  uVar8 = 0;
  pcVar4 = format_telnet_command
                     (pn->ps->remote_addr,pn->ps->remote_port,(Conf *)pn[-1].itr,(uint *)0x0);
  *(char **)&pn[-1].done = pcVar4;
  conf_set_str((Conf *)pn[-1].itr,0x11,"*password*");
  pcVar4 = format_telnet_command
                     (pn->ps->remote_addr,pn->ps->remote_port,(Conf *)pn[-1].itr,(uint *)0x0);
  buf_o = strbuf_new();
  pl.len = 0x1e;
  pl.ptr = "Sending Telnet proxy command: ";
  BinarySink_put_datapl(buf_o->binarysink_,pl);
  sVar7 = strlen(pcVar4);
  str.len = sVar7;
  str.ptr = pcVar4;
  BinarySink_put_c_string_literal(buf_o->binarysink_,str);
  pPVar2 = pn->ps->plug;
  (*pPVar2->vt->log)(pPVar2,PLUGLOG_PROXY_MSG,(SockAddr *)0x0,0,buf_o->s,0);
  strbuf_free(buf_o);
  safefree(pcVar4);
  pcVar4 = *(char **)&pn[-1].done;
  sVar7 = strlen(pcVar4);
  pl_00.len = sVar7;
  pl_00.ptr = pcVar4;
  BinarySink_put_datapl(pn->output[0].binarysink_,pl_00);
  pn->done = true;
LAB_001469eb:
  *(undefined4 *)ctx = uVar8;
  return;
}

Assistant:

static void proxy_telnet_process_queue(ProxyNegotiator *pn)
{
    TelnetProxyNegotiator *s = container_of(pn, TelnetProxyNegotiator, pn);

    crBegin(s->crLine);

    s->conf = conf_copy(pn->ps->conf);

    /*
     * Make an initial attempt to figure out the command we want, and
     * see if it tried to include a username or password that we don't
     * have.
     */
    {
        unsigned flags;
        s->formatted_cmd = format_telnet_command(
            pn->ps->remote_addr, pn->ps->remote_port, s->conf, &flags);

        if (pn->itr && (flags & (TELNET_CMD_MISSING_USERNAME |
                                 TELNET_CMD_MISSING_PASSWORD))) {
            burnstr(s->formatted_cmd);
            s->formatted_cmd = NULL;

            /*
             * We're missing at least one of the two parts, and we
             * have an Interactor we can use to prompt for them, so
             * try it.
             */
            s->prompts = proxy_new_prompts(pn->ps);
            s->prompts->to_server = true;
            s->prompts->from_server = false;
            s->prompts->name = dupstr("Telnet proxy authentication");
            if (flags & TELNET_CMD_MISSING_USERNAME) {
                s->username_prompt_index = s->prompts->n_prompts;
                add_prompt(s->prompts, dupstr("Proxy username: "), true);
            } else {
                s->username_prompt_index = -1;
            }
            if (flags & TELNET_CMD_MISSING_PASSWORD) {
                s->password_prompt_index = s->prompts->n_prompts;
                add_prompt(s->prompts, dupstr("Proxy password: "), false);
            } else {
                s->password_prompt_index = -1;
            }

            /*
             * This prompt is presented extremely early in PuTTY's
             * setup. (Very promptly, you might say.)
             *
             * In particular, we can get here through a chain of
             * synchronous calls from backend_init, which means (in
             * GUI PuTTY) that the terminal we'll be sending this
             * prompt to may not have its Ldisc set up yet (due to
             * cyclic dependencies among all the things that have to
             * be initialised).
             *
             * So we'll start by having ourself called back via a
             * toplevel callback, to make sure we don't call
             * seat_get_userpass_input until we've returned from
             * backend_init and the frontend has finished getting
             * everything ready.
             */
            queue_toplevel_callback(proxy_telnet_process_queue_callback, s);
            crReturnV;

            while (true) {
                SeatPromptResult spr = seat_get_userpass_input(
                    interactor_announce(pn->itr), s->prompts);
                if (spr.kind == SPRK_OK) {
                    break;
                } else if (spr_is_abort(spr)) {
                    proxy_spr_abort(pn, spr);
                    crStopV;
                }
                crReturnV;
            }

            if (s->username_prompt_index != -1) {
                conf_set_str(
                    s->conf, CONF_proxy_username,
                    prompt_get_result_ref(
                        s->prompts->prompts[s->username_prompt_index]));
            }

            if (s->password_prompt_index != -1) {
                conf_set_str(
                    s->conf, CONF_proxy_password,
                    prompt_get_result_ref(
                        s->prompts->prompts[s->password_prompt_index]));
            }

            free_prompts(s->prompts);
            s->prompts = NULL;
        }

        /*
         * Now format the command a second time, with the results of
         * those prompts written into s->conf.
         */
        s->formatted_cmd = format_telnet_command(
            pn->ps->remote_addr, pn->ps->remote_port, s->conf, NULL);
    }

    /*
     * Log the command, with some changes. Firstly, we regenerate it
     * with the password masked; secondly, we escape control
     * characters so that the log message is printable.
     */
    conf_set_str(s->conf, CONF_proxy_password, "*password*");
    {
        char *censored_cmd = format_telnet_command(
            pn->ps->remote_addr, pn->ps->remote_port, s->conf, NULL);

        strbuf *logmsg = strbuf_new();
        put_datapl(logmsg, PTRLEN_LITERAL("Sending Telnet proxy command: "));
        put_c_string_literal(logmsg, ptrlen_from_asciz(censored_cmd));

        plug_log(pn->ps->plug, PLUGLOG_PROXY_MSG, NULL, 0, logmsg->s, 0);
        strbuf_free(logmsg);
        sfree(censored_cmd);
    }

    /*
     * Actually send the command.
     */
    put_dataz(pn->output, s->formatted_cmd);

    /*
     * Unconditionally report success. We don't hang around waiting
     * for error messages from the proxy, because this proxy type is
     * so ad-hoc that we wouldn't know how to even recognise an error
     * message if we saw one, let alone what to do about it.
     */
    pn->done = true;

    crFinishV;
}